

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O1

QSize __thiscall QIcon::actualSize(QIcon *this,QWindow *window,QSize *size,Mode mode,State state)

{
  QIconEngine *pQVar1;
  uint uVar2;
  QSize QVar3;
  QSize QVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  double displayDevicePixelRatio;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QSize actualSize;
  ulong local_40;
  QSize local_38;
  long local_30;
  Representation extraout_var;
  Representation extraout_var_00;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d == (QIconPrivate *)0x0) {
    QVar4.wd.m_i = -1;
    QVar4.ht.m_i = -1;
  }
  else {
    if (window == (QWindow *)0x0) {
      displayDevicePixelRatio = QGuiApplication::devicePixelRatio(QCoreApplication::self);
    }
    else {
      displayDevicePixelRatio = QWindow::devicePixelRatio(window);
    }
    if (displayDevicePixelRatio <= 1.0) {
      pQVar1 = this->d->engine;
      QVar4.wd.m_i = (*pQVar1->_vptr_QIconEngine[3])(pQVar1,size,(ulong)mode,(ulong)state);
      QVar4.ht.m_i = extraout_var_00.m_i;
    }
    else {
      local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = this->d->engine;
      dVar9 = displayDevicePixelRatio * (double)(*size).wd.m_i;
      dVar12 = displayDevicePixelRatio * (double)(*size).ht.m_i;
      auVar10._0_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
      auVar10._8_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
      auVar10 = minpd(_DAT_00684790,auVar10);
      auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
      auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
      uVar2 = movmskpd((int)this->d,auVar6);
      uVar5 = 0x8000000000000000;
      if ((uVar2 & 2) != 0) {
        uVar5 = (ulong)(uint)(int)auVar10._8_8_ << 0x20;
      }
      local_40 = 0x80000000;
      if ((uVar2 & 1) != 0) {
        local_40 = (ulong)(uint)(int)auVar10._0_8_;
      }
      local_40 = local_40 | uVar5;
      QVar3.wd.m_i = (*pQVar1->_vptr_QIconEngine[3])(pQVar1,&local_40,(ulong)mode,(ulong)state);
      QVar3.ht.m_i = extraout_var.m_i;
      local_38 = QVar3;
      auVar7._0_8_ = QIconPrivate::pixmapDevicePixelRatio(displayDevicePixelRatio,size,&local_38);
      auVar11._0_8_ = (double)QVar3.wd.m_i;
      auVar11._8_8_ = (double)extraout_var.m_i;
      auVar7._8_8_ = auVar7._0_8_;
      auVar10 = divpd(auVar11,auVar7);
      auVar8._0_8_ = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar10._0_8_;
      auVar8._8_8_ = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar10._8_8_;
      auVar10 = minpd(_DAT_00684790,auVar8);
      auVar10 = maxpd(auVar10,_DAT_006847a0);
      QVar4.wd.m_i = (int)auVar10._0_8_;
      QVar4.ht.m_i = (int)auVar10._8_8_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QIcon::actualSize(QWindow *window, const QSize &size, Mode mode, State state) const
{
    if (!d)
        return QSize();

    qreal devicePixelRatio = window ? window->devicePixelRatio() : qApp->devicePixelRatio();

    // Handle the simple normal-dpi case:
    if (!(devicePixelRatio > 1.0))
        return d->engine->actualSize(size, mode, state);

    QSize actualSize = d->engine->actualSize(size * devicePixelRatio, mode, state);
    return actualSize / d->pixmapDevicePixelRatio(devicePixelRatio, size, actualSize);
}